

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

bool __thiscall presolve::HPresolve::isImpliedIntegral(HPresolve *this,HighsInt col)

{
  long lVar1;
  bool bVar2;
  reference pvVar3;
  reference this_00;
  char *pcVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar7;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  int __c_08;
  int extraout_EDX_01;
  int __c_09;
  int __c_10;
  int __c_11;
  int __c_12;
  int extraout_EDX_02;
  int __c_13;
  int __c_14;
  int __c_15;
  int __c_16;
  iterator *piVar8;
  long *in_RDI;
  reference pHVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double dVar10;
  HPresolve *this_01;
  double extraout_XMM0_Qa_04;
  double rLower;
  double rUpper;
  double scale_1;
  HighsSliceNonzero *nz_1;
  iterator __end1_1;
  iterator __begin1_1;
  HighsTripletListSlice *__range1_1;
  double scale;
  double rowUpper;
  double rowLower;
  HighsSliceNonzero *nz;
  iterator __end1;
  iterator __begin1;
  HighsTripletListSlice *__range1;
  bool runDualDetection;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe08;
  HPresolve *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe38;
  HPresolve *in_stack_fffffffffffffe40;
  double local_170;
  value_type local_158;
  HighsInt *in_stack_fffffffffffffef8;
  HighsInt in_stack_ffffffffffffff04;
  HPresolve *in_stack_ffffffffffffff08;
  iterator local_e8;
  undefined1 local_c8 [32];
  undefined1 *local_a8;
  double local_a0;
  double local_98;
  value_type local_90;
  reference local_88;
  iterator local_80;
  iterator local_60;
  undefined1 local_40 [32];
  undefined1 *local_20;
  byte local_15;
  bool local_1;
  
  local_15 = 1;
  getColumnVector(in_stack_fffffffffffffe40,(HighsInt)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  local_20 = local_40;
  HighsMatrixSlice<HighsTripletListSlice>::begin
            ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffe10);
  HighsMatrixSlice<HighsTripletListSlice>::end
            ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffe10);
  do {
    piVar8 = &local_80;
    bVar2 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_60,piVar8);
    if (!bVar2) {
      if ((local_15 & 1) == 0) {
        local_1 = false;
      }
      else {
        getColumnVector(in_stack_fffffffffffffe40,
                        (HighsInt)((ulong)in_stack_fffffffffffffe38 >> 0x20));
        local_a8 = local_c8;
        HighsMatrixSlice<HighsTripletListSlice>::begin
                  ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffe10);
        HighsMatrixSlice<HighsTripletListSlice>::end
                  ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffe10);
        while( true ) {
          piVar8 = (iterator *)&stack0xfffffffffffffef8;
          bVar2 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_e8,piVar8);
          if (!bVar2) break;
          this_00 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_e8);
          HighsSliceNonzero::value(this_00);
          pcVar4 = HighsSliceNonzero::index(this_00,(char *)piVar8,__c_07);
          pcVar4 = (char *)((ulong)pcVar4 & 0xffffffff);
          bVar2 = rowCoefficientsIntegral
                            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                             (double)in_stack_fffffffffffffef8);
          if (!bVar2) {
            return false;
          }
          lVar1 = *in_RDI;
          pcVar4 = HighsSliceNonzero::index(this_00,pcVar4,__c_08);
          pcVar4 = (char *)(long)(int)pcVar4;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x68),
                              (size_type)pcVar4);
          if ((*pvVar5 != INFINITY) || (iVar7 = extraout_EDX_01, NAN(*pvVar5))) {
            pHVar9 = this_00;
            HighsSliceNonzero::value(this_00);
            std::abs((int)pHVar9);
            pvVar6 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68);
            pcVar4 = HighsSliceNonzero::index(this_00,pcVar4,__c_09);
            pcVar4 = (char *)(long)(int)pcVar4;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar6,(size_type)pcVar4);
            dVar10 = *pvVar5;
            std::abs((int)pvVar6);
            dVar10 = floor(dVar10 * extraout_XMM0_Qa_00 + (double)in_RDI[4]);
            pvVar6 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68);
            pcVar4 = HighsSliceNonzero::index(this_00,pcVar4,__c_10);
            pcVar4 = (char *)(long)(int)pcVar4;
            std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(size_type)pcVar4);
            std::abs((int)pvVar6);
            iVar7 = __c_11;
            if (*(double *)(in_RDI[1] + 0x108) <= extraout_XMM0_Qa_01 &&
                extraout_XMM0_Qa_01 != *(double *)(in_RDI[1] + 0x108)) {
              pvVar6 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68);
              pcVar4 = HighsSliceNonzero::index(this_00,pcVar4,__c_11);
              pcVar4 = (char *)(long)(int)pcVar4;
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar6,(size_type)pcVar4);
              *pvVar5 = extraout_XMM0_Qa * dVar10;
              pcVar4 = HighsSliceNonzero::index(this_00,pcVar4,__c_12);
              pcVar4 = (char *)((ulong)pcVar4 & 0xffffffff);
              markChangedRow(in_stack_fffffffffffffe10,
                             (HighsInt)((ulong)in_stack_fffffffffffffe08 >> 0x20));
              iVar7 = extraout_EDX_02;
            }
          }
          pvVar6 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50);
          pcVar4 = HighsSliceNonzero::index(this_00,pcVar4,iVar7);
          pcVar4 = (char *)(long)(int)pcVar4;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar6,(size_type)pcVar4);
          if ((*pvVar5 != -INFINITY) || (NAN(*pvVar5))) {
            pHVar9 = this_00;
            HighsSliceNonzero::value(this_00);
            std::abs((int)pHVar9);
            pvVar6 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50);
            pcVar4 = HighsSliceNonzero::index(this_00,pcVar4,__c_13);
            pcVar4 = (char *)(long)(int)pcVar4;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar6,(size_type)pcVar4);
            dVar10 = *pvVar5;
            std::abs((int)pvVar6);
            dVar10 = ceil(dVar10 * extraout_XMM0_Qa_03 + -(double)in_RDI[4]);
            this_01 = (HPresolve *)(extraout_XMM0_Qa_02 * dVar10);
            pvVar6 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50);
            pcVar4 = HighsSliceNonzero::index(this_00,pcVar4,__c_14);
            pcVar4 = (char *)(long)(int)pcVar4;
            std::vector<double,_std::allocator<double>_>::operator[](pvVar6,(size_type)pcVar4);
            std::abs((int)pvVar6);
            if (*(double *)(in_RDI[1] + 0x108) <= extraout_XMM0_Qa_04 &&
                extraout_XMM0_Qa_04 != *(double *)(in_RDI[1] + 0x108)) {
              in_stack_fffffffffffffe08 =
                   (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50);
              pcVar4 = HighsSliceNonzero::index(this_00,pcVar4,__c_15);
              pcVar4 = (char *)(long)(int)pcVar4;
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (in_stack_fffffffffffffe08,(size_type)pcVar4);
              *pvVar5 = (value_type)this_01;
              HighsSliceNonzero::index(this_00,pcVar4,__c_16);
              markChangedRow(this_01,(HighsInt)((ulong)in_stack_fffffffffffffe08 >> 0x20));
              in_stack_fffffffffffffe10 = this_01;
            }
          }
          HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_e8);
        }
        local_1 = true;
      }
      return local_1;
    }
    local_88 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_60);
    pcVar4 = HighsSliceNonzero::index(local_88,(char *)piVar8,__c);
    pcVar4 = (char *)(long)(int)pcVar4;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(size_type)pcVar4);
    if (*pvVar3 < 2) {
LAB_006eca9e:
      local_15 = 0;
    }
    else {
      pcVar4 = HighsSliceNonzero::index(local_88,pcVar4,__c_00);
      pcVar4 = (char *)(long)(int)pcVar4;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x23),(size_type)pcVar4);
      iVar7 = *pvVar3;
      pcVar4 = HighsSliceNonzero::index(local_88,pcVar4,__c_01);
      pcVar4 = (char *)(long)(int)pcVar4;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(size_type)pcVar4);
      if (iVar7 < *pvVar3) goto LAB_006eca9e;
      pcVar4 = HighsSliceNonzero::index(local_88,pcVar4,__c_02);
      pcVar4 = (char *)((ulong)pcVar4 & 0xffffffff);
      bVar2 = isImpliedEquationAtUpper
                        (in_stack_fffffffffffffe10,
                         (HighsInt)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      if (bVar2) {
        lVar1 = *in_RDI;
        pcVar4 = HighsSliceNonzero::index(local_88,pcVar4,__c_03);
        pcVar4 = (char *)(long)(int)pcVar4;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x68),
                            (size_type)pcVar4);
        local_158 = *pvVar5;
        iVar7 = extraout_EDX;
      }
      else {
        lVar1 = *in_RDI;
        pcVar4 = HighsSliceNonzero::index(local_88,pcVar4,__c_03);
        pcVar4 = (char *)(long)(int)pcVar4;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x50),
                            (size_type)pcVar4);
        local_158 = *pvVar5;
        iVar7 = extraout_EDX_00;
      }
      local_90 = local_158;
      pcVar4 = HighsSliceNonzero::index(local_88,pcVar4,iVar7);
      pcVar4 = (char *)((ulong)pcVar4 & 0xffffffff);
      bVar2 = isImpliedEquationAtLower
                        (in_stack_fffffffffffffe10,
                         (HighsInt)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      if (bVar2) {
        lVar1 = *in_RDI;
        pcVar4 = HighsSliceNonzero::index(local_88,pcVar4,__c_04);
        pcVar4 = (char *)(long)(int)pcVar4;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x50),
                            (size_type)pcVar4);
        local_170 = *pvVar5;
      }
      else {
        lVar1 = *in_RDI;
        pcVar4 = HighsSliceNonzero::index(local_88,pcVar4,__c_04);
        pcVar4 = (char *)(long)(int)pcVar4;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x68),
                            (size_type)pcVar4);
        local_170 = *pvVar5;
      }
      local_98 = local_170;
      if ((local_170 == local_90) && (!NAN(local_170) && !NAN(local_90))) {
        local_15 = 0;
        local_a0 = HighsSliceNonzero::value(local_88);
        local_a0 = 1.0 / local_a0;
        pcVar4 = HighsSliceNonzero::index(local_88,pcVar4,__c_05);
        pcVar4 = (char *)((ulong)pcVar4 & 0xffffffff);
        bVar2 = rowCoefficientsIntegral
                          (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                           (double)in_stack_fffffffffffffef8);
        if (bVar2) {
          lVar1 = *in_RDI;
          pcVar4 = HighsSliceNonzero::index(local_88,pcVar4,__c_06);
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x50),(long)(int)pcVar4);
          fractionality<double>
                    ((double)in_stack_fffffffffffffe10,(double *)in_stack_fffffffffffffe08);
          return true;
        }
      }
    }
    HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_60);
  } while( true );
}

Assistant:

bool HPresolve::isImpliedIntegral(HighsInt col) {
  // check if the integer constraint on a variable is implied by the model
  assert(model->integrality_[col] == HighsVarType::kInteger);

  bool runDualDetection = true;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    // if not all other columns are integer, skip row and also do not try the
    // dual detection in the second loop as it must hold for all rows
    if (rowsize[nz.index()] < 2 ||
        rowsizeInteger[nz.index()] < rowsize[nz.index()]) {
      runDualDetection = false;
      continue;
    }

    double rowLower = isImpliedEquationAtUpper(nz.index())
                          ? model->row_upper_[nz.index()]
                          : model->row_lower_[nz.index()];

    double rowUpper = isImpliedEquationAtLower(nz.index())
                          ? model->row_lower_[nz.index()]
                          : model->row_upper_[nz.index()];

    if (rowUpper == rowLower) {
      // if there is an equation the dual detection does not need to be tried
      runDualDetection = false;
      double scale = 1.0 / nz.value();
      if (!rowCoefficientsIntegral(nz.index(), scale)) continue;

      if (fractionality(model->row_lower_[nz.index()] * scale) >
          primal_feastol) {
        // todo infeasible
      }

      return true;
    }
  }

  if (!runDualDetection) return false;

  for (const HighsSliceNonzero& nz : getColumnVector(col)) {
    double scale = 1.0 / nz.value();
    // if row coefficients are not integral, variable is not (implied) integral
    if (!rowCoefficientsIntegral(nz.index(), scale)) return false;
    if (model->row_upper_[nz.index()] != kHighsInf) {
      // right-hand side: scale, round down and unscale again
      double rUpper =
          std::abs(nz.value()) *
          std::floor(model->row_upper_[nz.index()] * std::abs(scale) +
                     primal_feastol);
      // check if modification is large enough
      if (std::abs(model->row_upper_[nz.index()] - rUpper) >
          options->small_matrix_value) {
        // update right-hand side and mark row as changed
        model->row_upper_[nz.index()] = rUpper;
        markChangedRow(nz.index());
      }
    }
    if (model->row_lower_[nz.index()] != -kHighsInf) {
      // left-hand side: scale, round up and unscale again
      double rLower =
          std::abs(nz.value()) *
          std::ceil(model->row_lower_[nz.index()] * std::abs(scale) -
                    primal_feastol);
      // check if modification is large enough
      if (std::abs(model->row_lower_[nz.index()] - rLower) >
          options->small_matrix_value) {
        // update left-hand side and mark row as changed
        model->row_lower_[nz.index()] = rLower;
        markChangedRow(nz.index());
      }
    }
  }

  return true;
}